

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O1

void host_server(ENetHost *server)

{
  ushort uVar1;
  ENetPacket *pEVar2;
  unsigned_long_long uVar3;
  int iVar4;
  char *__format;
  ENetEvent event;
  ENetEvent local_50;
  
  iVar4 = enet_host_service(server,&local_50,2);
  if (0 < iVar4) {
    do {
      switch(local_50.type) {
      case ENET_EVENT_TYPE_CONNECT:
        printf("A new peer with ID %u connected from ::1:%u.\n",
               (ulong)(local_50.peer)->incomingPeerID,(ulong)((local_50.peer)->address).port);
        uVar3 = g_counter + 1;
        (local_50.peer)->data = (void *)g_counter;
        g_counter = uVar3;
        break;
      case ENET_EVENT_TYPE_DISCONNECT:
        uVar1 = (local_50.peer)->incomingPeerID;
        __format = "Peer with ID %u disconnected.\n";
        goto LAB_00107304;
      case ENET_EVENT_TYPE_RECEIVE:
        printf("A packet of length %zu containing %s was received from %s on channel %u.\n",
               (local_50.packet)->dataLength,(local_50.packet)->data,(local_50.peer)->data,
               (ulong)local_50.channelID);
        pEVar2 = local_50.packet;
        if (local_50.packet != (ENetPacket *)0x0) {
          if ((local_50.packet)->freeCallback != (ENetPacketFreeCallback)0x0) {
            (*(local_50.packet)->freeCallback)(local_50.packet);
          }
          (*callbacks.free)(pEVar2);
        }
        break;
      case ENET_EVENT_TYPE_DISCONNECT_TIMEOUT:
        uVar1 = (local_50.peer)->incomingPeerID;
        __format = "Client %u timeout.\n";
LAB_00107304:
        printf(__format,(ulong)uVar1);
        g_disconnected = g_disconnected + 1;
        (local_50.peer)->data = (void *)0x0;
      }
      iVar4 = enet_host_service(server,&local_50,2);
    } while (0 < iVar4);
  }
  return;
}

Assistant:

void host_server(ENetHost *server) {
    ENetEvent event;
    while (enet_host_service(server, &event, 2) > 0) {
        switch (event.type) {
            case ENET_EVENT_TYPE_CONNECT:
                printf("A new peer with ID %u connected from ::1:%u.\n", event.peer->incomingPeerID , event.peer->address.port);
                /* Store any relevant client information here. */
                event.peer->data = (void*)(g_counter++);
                break;
            case ENET_EVENT_TYPE_RECEIVE:
                printf("A packet of length %zu containing %s was received from %s on channel %u.\n",
                        event.packet->dataLength,
                        event.packet->data,
                        (char *)event.peer->data,
                        event.channelID);

                /* Clean up the packet now that we're done using it. */
                enet_packet_destroy (event.packet);
                break;

            case ENET_EVENT_TYPE_DISCONNECT:
                printf ("Peer with ID %u disconnected.\n", event.peer->incomingPeerID);
                g_disconnected++;
                /* Reset the peer's client information. */
                event.peer->data = NULL;
                break;

            case ENET_EVENT_TYPE_DISCONNECT_TIMEOUT:
                printf ("Client %u timeout.\n", event.peer->incomingPeerID);
                g_disconnected++;
                /* Reset the peer's client information. */
                event.peer->data = NULL;
                break;

            case ENET_EVENT_TYPE_NONE: break;
        }
    }
}